

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::BackgroundRescan(Recycler *this,RescanFlags rescanFlags)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  size_t sVar5;
  size_t rescannedPageCount;
  RescanFlags rescanFlags_local;
  Recycler *this_local;
  
  if ((this->isProcessingRescan & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x110b,"(!this->isProcessingRescan)","!this->isProcessingRescan");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->isProcessingRescan = true;
  if ((DAT_01eca37e & 1) != 0) {
    JsUtil::
    BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
    ::LockResize(&this->pendingWriteBarrierBlockMap);
    JsUtil::
    BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>
    ::Map<Memory::Recycler::BackgroundRescan(Memory::RescanFlags)::__0>
              ((BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>
                *)&this->pendingWriteBarrierBlockMap);
    JsUtil::
    BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
    ::UnlockResize(&this->pendingWriteBarrierBlockMap);
  }
  uVar3 = HeapBlockMap64::Rescan
                    (&this->heapBlockMap,this,
                     (rescanFlags & RescanFlags_ResetWriteWatch) != RescanFlags_None);
  sVar5 = HeapInfoManager::Rescan(&this->autoHeap,rescanFlags);
  this_local = (Recycler *)(sVar5 + uVar3);
  this->backgroundRescanCount = this->backgroundRescanCount + '\x01';
  bVar2 = NeedOOMRescan(this);
  if (bVar2) {
    this->isProcessingRescan = false;
    this_local = (Recycler *)&DAT_ffffffffffffffff;
  }
  else if ((rescanFlags & RescanFlags_ResetWriteWatch) != RescanFlags_None) {
    this->isProcessingRescan = false;
  }
  return (size_t)this_local;
}

Assistant:

size_t
Recycler::BackgroundRescan(RescanFlags rescanFlags)
{
    Assert(!this->isProcessingRescan);

    DebugOnly(this->isProcessingRescan = true);

    GCETW(GC_BACKGROUNDRESCAN_START, (this, backgroundRescanCount));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundRescanPhase);

#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        pendingWriteBarrierBlockMap.LockResize();
        pendingWriteBarrierBlockMap.Map([](void* address, size_t size)
        {
            RecyclerWriteBarrierManager::WriteBarrier(address, size);
        });
        pendingWriteBarrierBlockMap.UnlockResize();
    }
#endif

    size_t rescannedPageCount = heapBlockMap.Rescan(this, ((rescanFlags & RescanFlags_ResetWriteWatch) != 0));

    rescannedPageCount += autoHeap.Rescan(rescanFlags);

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundRescanPhase);
    GCETW(GC_BACKGROUNDRESCAN_STOP, (this, backgroundRescanCount));
    this->backgroundRescanCount++;

    if (!this->NeedOOMRescan())
    {
        if ((rescanFlags & RescanFlags_ResetWriteWatch) != 0)
        {
            DebugOnly(this->isProcessingRescan = false);
        }

        return rescannedPageCount;
    }

    DebugOnly(this->isProcessingRescan = false);

    return Recycler::InvalidScanRootBytes;
}